

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O0

int acutest_select_(char *pattern)

{
  int iVar1;
  char *pcVar2;
  char *in_RDI;
  int n;
  int i;
  int local_18;
  int local_14;
  int local_4;
  
  local_18 = 0;
  local_14 = 0;
  do {
    if (acutest_list_size_ <= local_14) {
LAB_0010537c:
      if (local_18 == 0) {
        for (local_14 = 0; local_14 < acutest_list_size_; local_14 = local_14 + 1) {
          iVar1 = acutest_name_contains_word_(pattern,_n);
          if (iVar1 != 0) {
            acutest_test_data_[local_14].state = ACUTEST_STATE_SELECTED;
            local_18 = local_18 + 1;
          }
        }
        if (local_18 < 1) {
          for (local_14 = 0; local_14 < acutest_list_size_; local_14 = local_14 + 1) {
            pcVar2 = strstr(acutest_list_[local_14].name,in_RDI);
            if (pcVar2 != (char *)0x0) {
              acutest_test_data_[local_14].state = ACUTEST_STATE_SELECTED;
              local_18 = local_18 + 1;
            }
          }
          local_4 = local_18;
        }
        else {
          local_4 = local_18;
        }
      }
      else {
        local_4 = local_18;
      }
      return local_4;
    }
    iVar1 = strcmp(acutest_list_[local_14].name,in_RDI);
    if (iVar1 == 0) {
      acutest_test_data_[local_14].state = ACUTEST_STATE_SELECTED;
      local_18 = 1;
      goto LAB_0010537c;
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

static int
acutest_select_(const char* pattern)
{
    int i;
    int n = 0;

    /* Try exact match. */
    for(i = 0; i < acutest_list_size_; i++) {
        if(strcmp(acutest_list_[i].name, pattern) == 0) {
            acutest_test_data_[i].state = ACUTEST_STATE_SELECTED;
            n++;
            break;
        }
    }
    if(n > 0)
        return n;

    /* Try word match. */
    for(i = 0; i < acutest_list_size_; i++) {
        if(acutest_name_contains_word_(acutest_list_[i].name, pattern)) {
            acutest_test_data_[i].state = ACUTEST_STATE_SELECTED;
            n++;
        }
    }
    if(n > 0)
        return n;

    /* Try relaxed match. */
    for(i = 0; i < acutest_list_size_; i++) {
        if(strstr(acutest_list_[i].name, pattern) != NULL) {
            acutest_test_data_[i].state = ACUTEST_STATE_SELECTED;
            n++;
        }
    }

    return n;
}